

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall
QLocale::formattedDataSize(QLocale *this,qint64 bytes,int precision,DataSizeFormats format)

{
  bool bVar1;
  enable_if_t<std::conjunction_v<std::is_integral<unsigned_long_long>,_std::is_unsigned<unsigned_long_long>_>,_int>
  eVar2;
  QLocalePrivate *pQVar3;
  long in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  __type_conflict3 _Var4;
  QStringView QVar5;
  QStringView QVar6;
  QStringBuilder<const_QString_&,_char16_t> QVar7;
  int log2_1024;
  int log10_1000;
  int base;
  int power;
  DataRange range;
  QStringView unit;
  QString number;
  undefined4 in_stack_fffffffffffffe88;
  DataSizeFormat in_stack_fffffffffffffe8c;
  QStringBuilder<const_QString_&,_char16_t> *in_stack_fffffffffffffe90;
  undefined6 in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffe9e;
  DataRange *in_stack_fffffffffffffea0;
  DataRange *in_stack_fffffffffffffea8;
  qlonglong in_stack_fffffffffffffeb0;
  QLocale *in_stack_fffffffffffffeb8;
  QLocale *in_stack_fffffffffffffec0;
  int local_dc;
  QFlagsStorageHelper<QLocale::DataSizeFormat,_4> local_7c;
  DataRange local_78;
  QStringView local_70;
  int local_5c;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QFlagsStorageHelper<QLocale::DataSizeFormat,_4> local_3c;
  int local_38 [2];
  QString *local_30;
  char16_t local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == 0) {
    local_dc = 0;
  }
  else {
    local_3c.super_QFlagsStorage<QLocale::DataSizeFormat>.i =
         (QFlagsStorage<QLocale::DataSizeFormat>)
         QFlags<QLocale::DataSizeFormat>::operator&
                   ((QFlags<QLocale::DataSizeFormat> *)in_stack_fffffffffffffe90,
                    in_stack_fffffffffffffe8c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_3c);
    if (bVar1) {
      QtPrivate::qUnsignedAbs<long_long,_true>(in_RDX);
      _Var4 = std::log10<unsigned_long_long>(0x4daf9a);
      local_dc = (int)_Var4 / 3;
    }
    else {
      QtPrivate::qUnsignedAbs<long_long,_true>(in_RDX);
      eVar2 = QtPrivate::log2i<unsigned_long_long>(0x4dafcf);
      local_dc = eVar2 / 10;
    }
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  if (local_dc == 0) {
    toString(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  }
  else {
    std::pow<double,int>((double)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    local_5c = local_dc * 3;
    qMin<int>(local_38,&local_5c);
    toString(in_stack_fffffffffffffec0,(double)in_stack_fffffffffffffeb8,
             (char)((ulong)in_stack_fffffffffffffeb0 >> 0x38),(int)in_stack_fffffffffffffeb0);
  }
  local_70.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_70.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  QStringView::QStringView(&local_70);
  if (local_dc < 1) {
    pQVar3 = QSharedDataPointer<QLocalePrivate>::operator->
                       ((QSharedDataPointer<QLocalePrivate> *)0x4db21a);
    QLocaleData::byteCount(pQVar3->m_data);
    QVar6 = QLocaleData::DataRange::viewData
                      (in_stack_fffffffffffffea8,(char16_t *)in_stack_fffffffffffffea0);
    local_70.m_data = QVar6.m_data;
    QVar5.m_data = (storage_type_conflict *)in_stack_fffffffffffffec0;
    QVar5.m_size = QVar6.m_size;
  }
  else {
    local_78 = (DataRange)&DAT_aaaaaaaaaaaaaaaa;
    local_7c.super_QFlagsStorage<QLocale::DataSizeFormat>.i =
         (QFlagsStorage<QLocale::DataSizeFormat>)
         QFlags<QLocale::DataSizeFormat>::operator&
                   ((QFlags<QLocale::DataSizeFormat> *)in_stack_fffffffffffffe90,
                    in_stack_fffffffffffffe8c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_7c);
    if (bVar1) {
      pQVar3 = QSharedDataPointer<QLocalePrivate>::operator->
                         ((QSharedDataPointer<QLocalePrivate> *)0x4db137);
      local_78 = QLocaleData::byteAmountSI(pQVar3->m_data);
    }
    else {
      pQVar3 = QSharedDataPointer<QLocalePrivate>::operator->
                         ((QSharedDataPointer<QLocalePrivate> *)0x4db15f);
      local_78 = QLocaleData::byteAmountIEC(pQVar3->m_data);
    }
    QVar5 = QLocaleData::DataRange::viewListEntry
                      (in_stack_fffffffffffffea0,
                       (char16_t *)CONCAT26(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98),
                       (qsizetype)in_stack_fffffffffffffe90);
    local_70.m_data = QVar5.m_data;
  }
  local_70.m_size = QVar5.m_size;
  QVar7 = ::operator+((QString *)CONCAT26(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98),
                      (char16_t *)in_stack_fffffffffffffe90);
  local_30 = QVar7.a;
  local_28 = QVar7.b;
  ::operator+(in_stack_fffffffffffffe90,
              (QStringView *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  ::QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QStringView_&> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  QString::~QString((QString *)0x4db335);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QLocale::formattedDataSize(qint64 bytes, int precision, DataSizeFormats format) const
{
    int power, base = 1000;
    if (!bytes) {
        power = 0;
    } else if (format & DataSizeBase1000) {
        constexpr auto log10_1000 = 3; // std::log10(1000U)
        power = int(std::log10(QtPrivate::qUnsignedAbs(bytes))) / log10_1000;
    } else {
        constexpr auto log2_1024 = 10; // QtPrivate::log2i(1024U);
        power = QtPrivate::log2i(QtPrivate::qUnsignedAbs(bytes)) / log2_1024;
        base = 1024;
    }
    // Only go to doubles if we'll be using a quantifier:
    const QString number = power
        ? toString(bytes / std::pow(double(base), power), 'f', qMin(precision, 3 * power))
        : toString(bytes);

    // We don't support sizes in units larger than exbibytes because
    // the number of bytes would not fit into qint64.
    Q_ASSERT(power <= 6 && power >= 0);
    QStringView unit;
    if (power > 0) {
        QLocaleData::DataRange range = (format & DataSizeSIQuantifiers)
            ? d->m_data->byteAmountSI() : d->m_data->byteAmountIEC();
        unit = range.viewListEntry(byte_unit_data, power - 1);
    } else {
        unit = d->m_data->byteCount().viewData(byte_unit_data);
    }

    return number + u' ' + unit;
}